

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

Iterator<int,_true,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
          (Iterator<int,_true,_std::allocator<unsigned_long>_> *this)

{
  bool bVar1;
  size_t sVar2;
  CoordinateOrder *pCVar3;
  reference pvVar4;
  size_t sVar5;
  size_type sVar6;
  bool local_21;
  size_type local_20;
  size_t j_1;
  size_t j;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *this_local;
  
  local_21 = false;
  if (this->view_ != (view_pointer)0x0) {
    local_21 = this->index_ != 0;
  }
  marray_detail::Assert<bool>(local_21);
  this->index_ = this->index_ - 1;
  bVar1 = View<int,_true,_std::allocator<unsigned_long>_>::isSimple(this->view_);
  if (bVar1) {
    this->pointer_ = this->pointer_ + -1;
  }
  else {
    sVar5 = this->index_;
    sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::size(this->view_);
    if (sVar5 == sVar2) {
      this->pointer_ = this->pointer_ + -1;
      pCVar3 = View<int,_true,_std::allocator<unsigned_long>_>::coordinateOrder(this->view_);
      if (*pCVar3 == LastMajorOrder) {
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->coordinates_,0);
        *pvVar4 = *pvVar4 - 1;
      }
      else {
        sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this->view_);
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->coordinates_,sVar5 - 1);
        *pvVar4 = *pvVar4 - 1;
      }
    }
    else {
      pCVar3 = View<int,_true,_std::allocator<unsigned_long>_>::coordinateOrder(this->view_);
      if (*pCVar3 == LastMajorOrder) {
        for (j_1 = 0; sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                        (&this->coordinates_), j_1 < sVar6; j_1 = j_1 + 1) {
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->coordinates_,j_1);
          if (*pvVar4 != 0) {
            sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::strides(this->view_,j_1);
            this->pointer_ = this->pointer_ + -sVar5;
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->coordinates_,j_1);
            *pvVar4 = *pvVar4 - 1;
            break;
          }
          sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::shape(this->view_,j_1);
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->coordinates_,j_1);
          *pvVar4 = sVar5 - 1;
          sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::strides(this->view_,j_1);
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->coordinates_,j_1);
          this->pointer_ = this->pointer_ + sVar5 * *pvVar4;
        }
      }
      else {
        local_20 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this->view_);
        do {
          local_20 = local_20 - 1;
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->coordinates_,local_20);
          if (*pvVar4 != 0) {
            sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::strides(this->view_,local_20);
            this->pointer_ = this->pointer_ + -sVar5;
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->coordinates_,local_20);
            *pvVar4 = *pvVar4 - 1;
            break;
          }
          sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::shape(this->view_,local_20);
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->coordinates_,local_20);
          *pvVar4 = sVar5 - 1;
          sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::strides(this->view_,local_20);
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->coordinates_,local_20);
          this->pointer_ = this->pointer_ + sVar5 * *pvVar4;
        } while (local_20 != 0);
      }
    }
  }
  testInvariant(this);
  return this;
}

Assistant:

inline Iterator<T, isConst, A>&
Iterator<T, isConst, A>::operator--()
{
    marray_detail::Assert(MARRAY_NO_DEBUG || (view_ != 0 && index_ > 0));
    --index_;
    if(view_->isSimple()) {
        --pointer_;
    }
    else {
        if(index_ == view_->size()) { 
            // decrement from end iterator
            --pointer_;
            if(view_->coordinateOrder() == LastMajorOrder) {
                --coordinates_[0];
            }
            else { // FirstMajorOrder
                --coordinates_[view_->dimension() - 1];
            }
        }
        else {
            if(view_->coordinateOrder() == LastMajorOrder) {
                for(std::size_t j=0; j<coordinates_.size(); ++j) {
                    if(coordinates_[j] == 0) {
                        coordinates_[j] = view_->shape(j)-1;
                        pointer_ += view_->strides(j) * coordinates_[j];
                    }
                    else {
                        pointer_ -= view_->strides(j);
                        --coordinates_[j];
                        break;
                    }
                }
            }
            else { // FirstMajorOrder
                std::size_t j = view_->dimension() - 1;
                for(;;) {
                    if(coordinates_[j] == 0) {
                        coordinates_[j] = view_->shape(j)-1;
                        pointer_ += view_->strides(j) * coordinates_[j];
                    }
                    else {
                        pointer_ -= view_->strides(j);
                        --coordinates_[j];
                        break;
                    }
                    if(j == 0) {
                        break;
                    }
                    else {
                        --j;
                    }
                }
            }
        }
    }
    testInvariant();
    return *this;
}